

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync)

{
  pthread_mutex_t *memblk;
  pthread_cond_t *memblk_00;
  LRWorkerData *pLVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (lr_sync != (AV1LrSync *)0x0) {
    lVar3 = 0;
    do {
      memblk = lr_sync->mutex_[lVar3];
      if (memblk != (pthread_mutex_t *)0x0) {
        if (0 < lr_sync->rows) {
          lVar4 = 0;
          lVar2 = 0;
          do {
            pthread_mutex_destroy((pthread_mutex_t *)((long)lr_sync->mutex_[lVar3] + lVar4));
            lVar2 = lVar2 + 1;
            lVar4 = lVar4 + 0x28;
          } while (lVar2 < lr_sync->rows);
          memblk = lr_sync->mutex_[lVar3];
        }
        aom_free(memblk);
      }
      memblk_00 = lr_sync->cond_[lVar3];
      if (memblk_00 != (pthread_cond_t *)0x0) {
        if (0 < lr_sync->rows) {
          lVar4 = 0;
          lVar2 = 0;
          do {
            pthread_cond_destroy((pthread_cond_t *)((long)lr_sync->cond_[lVar3] + lVar4));
            lVar2 = lVar2 + 1;
            lVar4 = lVar4 + 0x30;
          } while (lVar2 < lr_sync->rows);
          memblk_00 = lr_sync->cond_[lVar3];
        }
        aom_free(memblk_00);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if (lr_sync->job_mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)lr_sync->job_mutex);
      aom_free(lr_sync->job_mutex);
    }
    lVar3 = 6;
    do {
      aom_free(lr_sync->mutex_[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 9);
    aom_free(lr_sync->job_queue);
    pLVar1 = lr_sync->lrworkerdata;
    if (pLVar1 != (LRWorkerData *)0x0) {
      if (1 < lr_sync->num_workers) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          pLVar1 = lr_sync->lrworkerdata;
          aom_free(*(void **)((pLVar1->error_info).detail + lVar3 + -0x30));
          aom_free(*(void **)((pLVar1->error_info).detail + lVar3 + -0x28));
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x1c0;
        } while (lVar2 < (long)lr_sync->num_workers + -1);
        pLVar1 = lr_sync->lrworkerdata;
      }
      aom_free(pLVar1);
    }
    lr_sync->jobs_enqueued = 0;
    lr_sync->jobs_dequeued = 0;
    *(undefined8 *)&lr_sync->lr_mt_exit = 0;
    lr_sync->lrworkerdata = (LRWorkerData *)0x0;
    lr_sync->job_queue = (AV1LrMTInfo *)0x0;
    lr_sync->num_planes = 0;
    lr_sync->num_workers = 0;
    lr_sync->job_mutex = (pthread_mutex_t *)0x0;
    lr_sync->cur_sb_col[2] = (int *)0x0;
    lr_sync->sync_range = 0;
    lr_sync->rows = 0;
    lr_sync->cur_sb_col[0] = (int *)0x0;
    lr_sync->cur_sb_col[1] = (int *)0x0;
    lr_sync->cond_[1] = (pthread_cond_t *)0x0;
    lr_sync->cond_[2] = (pthread_cond_t *)0x0;
    lr_sync->mutex_[2] = (pthread_mutex_t *)0x0;
    lr_sync->cond_[0] = (pthread_cond_t *)0x0;
    lr_sync->mutex_[0] = (pthread_mutex_t *)0x0;
    lr_sync->mutex_[1] = (pthread_mutex_t *)0x0;
  }
  return;
}

Assistant:

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync) {
  if (lr_sync != NULL) {
    int j;
#if CONFIG_MULTITHREAD
    int i;
    for (j = 0; j < MAX_MB_PLANE; j++) {
      if (lr_sync->mutex_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_mutex_destroy(&lr_sync->mutex_[j][i]);
        }
        aom_free(lr_sync->mutex_[j]);
      }
      if (lr_sync->cond_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_cond_destroy(&lr_sync->cond_[j][i]);
        }
        aom_free(lr_sync->cond_[j]);
      }
    }
    if (lr_sync->job_mutex != NULL) {
      pthread_mutex_destroy(lr_sync->job_mutex);
      aom_free(lr_sync->job_mutex);
    }
#endif  // CONFIG_MULTITHREAD
    for (j = 0; j < MAX_MB_PLANE; j++) {
      aom_free(lr_sync->cur_sb_col[j]);
    }

    aom_free(lr_sync->job_queue);

    if (lr_sync->lrworkerdata) {
      for (int worker_idx = 0; worker_idx < lr_sync->num_workers - 1;
           worker_idx++) {
        LRWorkerData *const workerdata_data =
            lr_sync->lrworkerdata + worker_idx;

        aom_free(workerdata_data->rst_tmpbuf);
        aom_free(workerdata_data->rlbs);
      }
      aom_free(lr_sync->lrworkerdata);
    }

    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*lr_sync);
  }
}